

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O0

void __thiscall
wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::erase
          (InsertOrderedMap<CFG::Block_*,_CFG::Branch_*> *this,Block **k)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator local_30;
  _Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_false>
  local_20;
  iterator it;
  Block **k_local;
  InsertOrderedMap<CFG::Block_*,_CFG::Branch_*> *this_local;
  
  it.
  super__Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_false>
               )k;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<CFG::Block_*,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>,_std::hash<CFG::Block_*>,_std::equal_to<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>_>_>
       ::find(&this->Map,k);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<CFG::Block_*,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>,_std::hash<CFG::Block_*>,_std::equal_to<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>_>_>
       ::end(&this->Map);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_false,_false>
                           *)&local_20);
    std::_List_const_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::_List_const_iterator
              (&local_30,&ppVar2->second);
    std::__cxx11::
    list<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
    ::erase(&this->List,local_30);
    std::
    unordered_map<CFG::Block_*,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>,_std::hash<CFG::Block_*>,_std::equal_to<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>_>_>
    ::erase(&this->Map,(iterator)local_20._M_cur);
  }
  return;
}

Assistant:

void erase(const Key& k) {
    auto it = Map.find(k);
    if (it != Map.end()) {
      List.erase(it->second);
      Map.erase(it);
    }
  }